

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O1

void greet_prog_furcas(CHAR_DATA *mob,CHAR_DATA *ch)

{
  PC_DATA *pPVar1;
  int iVar2;
  AFFECT_DATA *pAVar3;
  
  pAVar3 = affect_find(mob->affected,(int)gsn_lesser_demon);
  if ((pAVar3 != (AFFECT_DATA *)0x0) && (pAVar3->owner == ch)) {
    act("Eyes wide with amazement and fear, $n leaps backward away from you!",mob,(void *)0x0,ch,2);
    act("Eyes wide with amazement and fear, $n leaps backward away from $N!",mob,(void *)0x0,ch,1);
    do_say(mob,"Do not harm us, we hope it will not!  Here!  Here, take it!");
    pPVar1 = ch->pcdata;
    pPVar1->lesserdata[3] = 2;
    iVar2 = skill_lookup("darksight");
    pPVar1->learned[iVar2] = 1;
    send_to_char("Your eyes burn for a moment, and your vision seems somehow sharper.\n\r",ch);
    act("$n shrinks back into nearby shadows and is gone.",mob,(void *)0x0,(void *)0x0,0);
    extract_char(mob,true);
    return;
  }
  return;
}

Assistant:

void greet_prog_furcas(CHAR_DATA *mob, CHAR_DATA *ch)
{
	AFFECT_DATA *af = affect_find(mob->affected, gsn_lesser_demon);

	if (!af)
		return;

	if (ch != af->owner)
		return;

	act("Eyes wide with amazement and fear, $n leaps backward away from you!", mob, 0, ch, TO_VICT);
	act("Eyes wide with amazement and fear, $n leaps backward away from $N!", mob, 0, ch, TO_NOTVICT);

	do_say(mob, "Do not harm us, we hope it will not!  Here!  Here, take it!");

	ch->pcdata->lesserdata[LESSER_FURCAS] = FAVOR_GRANTED;
	ch->pcdata->learned[skill_lookup("darksight")] = 1;

	send_to_char("Your eyes burn for a moment, and your vision seems somehow sharper.\n\r", ch);
	act("$n shrinks back into nearby shadows and is gone.", mob, 0, 0, TO_ROOM);
	extract_char(mob, true);
}